

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  size_t sVar3;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  NodeRef nodeRef;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  NodeRef *pNVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  ulong uVar24;
  size_t sVar25;
  Primitive_conflict4 *prim;
  bool bVar26;
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM1 [64];
  vint4 ai;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_1;
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  vint4 bi;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_1;
  undefined1 auVar38 [16];
  vint4 bi_3;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [64];
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid0;
  InstanceArrayIntersectorK<4> local_34e8 [16];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar43 [64];
  
  sVar25 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar25 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar29 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    auVar31 = vpcmpeqd_avx(auVar29,(undefined1  [16])valid_i->field_0);
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar42 = auVar31 & auVar7;
    if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar42[0xf] < '\0')
    {
      auVar31 = vandps_avx(auVar7,auVar31);
      auVar7 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar44 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      aVar5.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar7,auVar31);
      fVar11 = *(float *)ray;
      fVar12 = *(float *)(ray + 4);
      fVar13 = *(float *)(ray + 8);
      fVar14 = *(float *)(ray + 0xc);
      auVar7 = *(undefined1 (*) [16])(ray + 0x10);
      auVar42._0_4_ = auVar31._0_4_ ^ auVar29._0_4_;
      auVar42._4_4_ = auVar31._4_4_ ^ auVar29._4_4_;
      auVar42._8_4_ = auVar31._8_4_ ^ auVar29._8_4_;
      auVar42._12_4_ = auVar31._12_4_ ^ auVar29._12_4_;
      auVar43 = ZEXT1664(auVar42);
      fVar15 = *(float *)(ray + 0x20);
      fVar16 = *(float *)(ray + 0x24);
      fVar17 = *(float *)(ray + 0x28);
      fVar18 = *(float *)(ray + 0x2c);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar25;
      stack_near[1].field_0 = aVar5;
      if (sVar25 != 0xfffffffffffffff8) {
        auVar39._8_4_ = 0x7fffffff;
        auVar39._0_8_ = 0x7fffffff7fffffff;
        auVar39._12_4_ = 0x7fffffff;
        auVar29 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar39);
        auVar41._8_4_ = 0x219392ef;
        auVar41._0_8_ = 0x219392ef219392ef;
        auVar41._12_4_ = 0x219392ef;
        auVar29 = vcmpps_avx(auVar29,auVar41,1);
        auVar42 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar41,auVar29);
        auVar29 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar39);
        auVar29 = vcmpps_avx(auVar29,auVar41,1);
        auVar6 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar41,auVar29);
        auVar29 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar39);
        auVar29 = vcmpps_avx(auVar29,auVar41,1);
        auVar29 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar41,auVar29);
        auVar39 = vrcpps_avx(auVar42);
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar32 = vfnmadd213ps_fma(auVar42,auVar39,auVar36);
        auVar42 = vrcpps_avx(auVar6);
        auVar41 = vfnmadd213ps_fma(auVar6,auVar42,auVar36);
        auVar6 = vrcpps_avx(auVar29);
        auVar29 = vfnmadd213ps_fma(auVar29,auVar6,auVar36);
        auVar41 = vfmadd132ps_fma(auVar41,auVar42,auVar42);
        auVar39 = vfmadd132ps_fma(auVar32,auVar39,auVar39);
        auVar6 = vfmadd132ps_fma(auVar29,auVar6,auVar6);
        pNVar22 = stack_node + 1;
        auVar29 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        auVar32._8_4_ = 0xff800000;
        auVar32._0_8_ = 0xff800000ff800000;
        auVar32._12_4_ = 0xff800000;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       vblendvps_avx(auVar32,auVar29,auVar31);
        paVar23 = &stack_near[2].field_0;
LAB_005b85cb:
        auVar42 = auVar43._0_16_;
        paVar1 = paVar23 + -1;
        auVar30 = ZEXT1664((undefined1  [16])*paVar1);
        paVar23 = paVar23 + -1;
        auVar29 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
        if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar29[0xf] < '\0') {
          do {
            if ((sVar25 & 8) != 0) {
              if (sVar25 == 0xfffffffffffffff8) goto LAB_005b8842;
              auVar29 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar30._0_16_,6);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') {
                uVar19 = (ulong)((uint)sVar25 & 0xf);
                auVar29 = vpcmpeqd_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0
                                      );
                valid0.field_0.i[1] = auVar43._4_4_ ^ auVar29._4_4_;
                valid0.field_0.i[0] = auVar43._0_4_ ^ auVar29._0_4_;
                valid0.field_0.i[2] = auVar43._8_4_ ^ auVar29._8_4_;
                valid0.field_0.i[3] = auVar43._12_4_ ^ auVar29._12_4_;
                auVar28 = auVar42;
                if (uVar19 == 8) goto LAB_005b8817;
                prim = (Primitive_conflict4 *)(sVar25 & 0xfffffffffffffff0);
                uVar24 = 1;
                goto LAB_005b8785;
              }
              break;
            }
            lVar20 = 0;
            sVar21 = 8;
            aVar27 = auVar44._0_16_;
            do {
              sVar3 = *(size_t *)((sVar25 & 0xfffffffffffffff0) + lVar20 * 8);
              if (sVar3 == 8) {
                auVar30 = ZEXT1664((undefined1  [16])aVar27);
                break;
              }
              uVar2 = *(undefined4 *)(sVar25 + 0x40 + lVar20 * 4);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar8._4_4_ = auVar39._4_4_ * -fVar12;
              auVar8._0_4_ = auVar39._0_4_ * -fVar11;
              auVar8._8_4_ = auVar39._8_4_ * -fVar13;
              auVar8._12_4_ = auVar39._12_4_ * -fVar14;
              auVar36 = vfmadd213ps_fma(auVar33,auVar39,auVar8);
              uVar2 = *(undefined4 *)(sVar25 + 0x80 + lVar20 * 4);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar9._4_4_ = auVar41._4_4_ * -auVar7._4_4_;
              auVar9._0_4_ = auVar41._0_4_ * -auVar7._0_4_;
              auVar9._8_4_ = auVar41._8_4_ * -auVar7._8_4_;
              auVar9._12_4_ = auVar41._12_4_ * -auVar7._12_4_;
              auVar28 = vfmadd213ps_fma(auVar34,auVar41,auVar9);
              uVar2 = *(undefined4 *)(sVar25 + 0xc0 + lVar20 * 4);
              auVar35._4_4_ = uVar2;
              auVar35._0_4_ = uVar2;
              auVar35._8_4_ = uVar2;
              auVar35._12_4_ = uVar2;
              auVar10._4_4_ = auVar6._4_4_ * -fVar16;
              auVar10._0_4_ = auVar6._0_4_ * -fVar15;
              auVar10._8_4_ = auVar6._8_4_ * -fVar17;
              auVar10._12_4_ = auVar6._12_4_ * -fVar18;
              auVar33 = vfmadd213ps_fma(auVar35,auVar6,auVar10);
              uVar2 = *(undefined4 *)(sVar25 + 0x60 + lVar20 * 4);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              auVar8 = vfmadd213ps_fma(auVar37,auVar39,auVar8);
              uVar2 = *(undefined4 *)(sVar25 + 0xa0 + lVar20 * 4);
              auVar38._4_4_ = uVar2;
              auVar38._0_4_ = uVar2;
              auVar38._8_4_ = uVar2;
              auVar38._12_4_ = uVar2;
              auVar9 = vfmadd213ps_fma(auVar38,auVar41,auVar9);
              uVar2 = *(undefined4 *)(sVar25 + 0xe0 + lVar20 * 4);
              auVar40._4_4_ = uVar2;
              auVar40._0_4_ = uVar2;
              auVar40._8_4_ = uVar2;
              auVar40._12_4_ = uVar2;
              auVar10 = vfmadd213ps_fma(auVar40,auVar6,auVar10);
              auVar29 = vpminsd_avx(auVar36,auVar8);
              auVar32 = vpminsd_avx(auVar28,auVar9);
              auVar29 = vpmaxsd_avx(auVar29,auVar32);
              auVar32 = vpminsd_avx(auVar33,auVar10);
              auVar32 = vpmaxsd_avx(auVar29,auVar32);
              auVar29 = vpmaxsd_avx(auVar36,auVar8);
              auVar36 = vpmaxsd_avx(auVar28,auVar9);
              auVar28 = vpminsd_avx(auVar29,auVar36);
              auVar29 = vpmaxsd_avx(auVar33,auVar10);
              auVar36 = vpmaxsd_avx(auVar32,(undefined1  [16])aVar5);
              auVar29 = vpminsd_avx(auVar29,(undefined1  [16])bi_8.field_0);
              auVar29 = vpminsd_avx(auVar28,auVar29);
              auVar29 = vcmpps_avx(auVar36,auVar29,2);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar29[0xf]) {
                auVar30 = ZEXT1664((undefined1  [16])aVar27);
                sVar3 = sVar21;
              }
              else {
                auVar29 = vblendvps_avx((undefined1  [16])auVar44._0_16_,auVar32,auVar29);
                auVar30 = ZEXT1664(auVar29);
                if (sVar21 != 8) {
                  pNVar22->ptr = sVar21;
                  pNVar22 = pNVar22 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar27;
                  paVar23 = paVar23 + 1;
                }
              }
              sVar21 = sVar3;
              lVar20 = lVar20 + 1;
              aVar27 = auVar30._0_16_;
            } while (lVar20 != 8);
            sVar25 = sVar21;
          } while (sVar21 != 8);
        }
        goto LAB_005b8719;
      }
LAB_005b8842:
      auVar7 = vandps_avx(auVar31,auVar42);
      auVar31._8_4_ = 0xff800000;
      auVar31._0_8_ = 0xff800000ff800000;
      auVar31._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar31);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar26 = uVar19 - 8 <= uVar24;
    uVar24 = uVar24 + 1;
    valid0.field_0 = aVar4;
    if (bVar26) break;
LAB_005b8785:
    InstanceArrayIntersectorK<4>::occluded(local_34e8,&valid0,&pre,ray,context,prim);
    aVar4.v = (__m128)vandnps_avx((undefined1  [16])local_34e8,valid0.field_0);
    auVar29 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_34e8;
    if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf])
    break;
  }
  auVar29 = vpcmpeqd_avx((undefined1  [16])local_34e8,(undefined1  [16])local_34e8);
  auVar28._0_4_ = aVar4.i[0] ^ auVar29._0_4_;
  auVar28._4_4_ = aVar4.i[1] ^ auVar29._4_4_;
  auVar28._8_4_ = aVar4.i[2] ^ auVar29._8_4_;
  auVar28._12_4_ = aVar4.i[3] ^ auVar29._12_4_;
  auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
LAB_005b8817:
  auVar42 = vorps_avx(auVar42,auVar28);
  auVar43 = ZEXT1664(auVar42);
  auVar29 = auVar29 & ~auVar42;
  if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf])
  goto LAB_005b8842;
  auVar29._8_4_ = 0xff800000;
  auVar29._0_8_ = 0xff800000ff800000;
  auVar29._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar29,auVar42);
LAB_005b8719:
  auVar42 = auVar43._0_16_;
  sVar25 = pNVar22[-1].ptr;
  pNVar22 = pNVar22 + -1;
  if (sVar25 == 0xfffffffffffffff8) goto LAB_005b8842;
  goto LAB_005b85cb;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }